

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O2

void __thiscall
cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::print
          (tag_scalar_t<QString,_cfgfile::qstring_trait_t> *this,QDomDocument *doc,
          QDomElement *parent)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  QDomNode *this_00;
  undefined8 *puVar7;
  QDomElement this_element;
  QDomText data;
  undefined1 local_80 [16];
  char16_t *pcStack_70;
  qsizetype local_68;
  QArrayDataPointer<char16_t> local_58;
  undefined1 local_40 [16];
  QDomNode local_30 [8];
  QDomNode local_28 [8];
  
  bVar5 = tag_t<cfgfile::qstring_trait_t>::is_defined(&this->super_tag_t<cfgfile::qstring_trait_t>);
  if (bVar5) {
    local_80._8_8_ = (this->super_tag_t<cfgfile::qstring_trait_t>).m_name.m_str.d.d;
    pcStack_70 = (this->super_tag_t<cfgfile::qstring_trait_t>).m_name.m_str.d.ptr;
    local_68 = (this->super_tag_t<cfgfile::qstring_trait_t>).m_name.m_str.d.size;
    if ((Data *)local_80._8_8_ != (Data *)0x0) {
      LOCK();
      (((Data *)local_80._8_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            (((Data *)local_80._8_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1)
      ;
      UNLOCK();
    }
    QDomDocument::createElement((QString *)local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(local_80 + 8));
    if (parent == (QDomElement *)0x0) {
      this_00 = local_28;
      QDomNode::appendChild(this_00);
    }
    else {
      this_00 = local_30;
      QDomNode::appendChild(this_00);
    }
    QDomNode::~QDomNode(this_00);
    local_58.d = (this->m_value).d.d;
    pcStack_70 = (this->m_value).d.ptr;
    local_68 = (this->m_value).d.size;
    if (local_58.d == (Data *)0x0) {
      local_80._8_8_ = (Data *)0x0;
    }
    else {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_80._8_8_ = local_58.d;
    }
    if ((Data *)local_80._8_8_ != (Data *)0x0) {
      LOCK();
      (((Data *)local_80._8_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_80._8_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_58.ptr = pcStack_70;
    local_58.size = local_68;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    to_cfgfile_format<cfgfile::qstring_trait_t>((string_t *)&local_58,(string_t *)(local_80 + 8));
    qVar4 = local_68;
    pcVar3 = pcStack_70;
    uVar2 = local_80._8_8_;
    local_80._8_8_ = local_58.d;
    pcStack_70 = local_58.ptr;
    local_58.d = (Data *)uVar2;
    local_58.ptr = pcVar3;
    local_68 = local_58.size;
    local_58.size = qVar4;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    local_58.d = (Data *)local_80._8_8_;
    local_58.ptr = pcStack_70;
    local_58.size = local_68;
    if ((Data *)local_80._8_8_ != (Data *)0x0) {
      LOCK();
      (((QArrayData *)local_80._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_80._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QDomDocument::createTextNode((QString *)local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QDomNode::appendChild((QDomNode *)(local_40 + 8));
    QDomNode::~QDomNode((QDomNode *)(local_40 + 8));
    iVar6 = (*(this->super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t[2])(this);
    if (*(long *)CONCAT44(extraout_var,iVar6) != ((long *)CONCAT44(extraout_var,iVar6))[1]) {
      iVar6 = (*(this->super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t[2])(this);
      puVar1 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var_00,iVar6))[1];
      for (puVar7 = *(undefined8 **)CONCAT44(extraout_var_00,iVar6); puVar7 != puVar1;
          puVar7 = puVar7 + 1) {
        (**(code **)(*(long *)*puVar7 + 0x20))((long *)*puVar7,doc,local_80);
      }
    }
    QDomNode::~QDomNode((QDomNode *)local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(local_80 + 8));
    QDomNode::~QDomNode((QDomNode *)local_80);
  }
  return;
}

Assistant:

void print( QDomDocument & doc, QDomElement * parent = 0 ) const override
	{
		if( this->is_defined() )
		{
			QDomElement this_element = doc.createElement( this->name() );

			if( !parent )
				doc.appendChild( this_element );
			else
				parent->appendChild( this_element );

			typename Trait::string_t value =
				format_t< typename Trait::string_t, Trait >::to_string( m_value );
			value = to_cfgfile_format< Trait >( value );

			QDomText data = doc.createTextNode( value );

			this_element.appendChild( data );

			if( !this->children().empty() )
			{
				for( const tag_t< Trait > * tag : this->children() )
					tag->print( doc, &this_element );
			}
		}
	}